

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeOffset(Vdbe *v,Select *p,int iContinue)

{
  int addr_00;
  int addr;
  int iContinue_local;
  Select *p_local;
  Vdbe *v_local;
  
  if ((p->iOffset != 0) && (iContinue != 0)) {
    sqlite3VdbeAddOp2(v,0x14,p->iOffset,-1);
    addr_00 = sqlite3VdbeAddOp1(v,0x79,p->iOffset);
    sqlite3VdbeAddOp2(v,1,0,iContinue);
    sqlite3VdbeJumpHere(v,addr_00);
  }
  return;
}

Assistant:

static void codeOffset(
  Vdbe *v,          /* Generate code into this VM */
  Select *p,        /* The SELECT statement being coded */
  int iContinue     /* Jump here to skip the current record */
){
  if( p->iOffset && iContinue!=0 ){
    int addr;
    sqlite3VdbeAddOp2(v, OP_AddImm, p->iOffset, -1);
    addr = sqlite3VdbeAddOp1(v, OP_IfNeg, p->iOffset);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, iContinue);
    VdbeComment((v, "skip OFFSET records"));
    sqlite3VdbeJumpHere(v, addr);
  }
}